

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha256_hw.c
# Opt level: O0

size_t tls1_multi_block_encrypt(void *vctx,uchar *out,uchar *inp,size_t inp_len,int n4x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  void *ptr_00;
  ulong uVar16;
  uint in_ECX;
  long lVar17;
  long in_RDX;
  uint *in_RSI;
  long in_RDI;
  int in_R8D;
  u32 ret__20;
  u32 ret__19;
  u32 ret__18;
  u32 ret__17;
  u32 ret__16;
  u32 ret__15;
  u32 ret__14;
  u32 ret__13;
  uchar *out0;
  uint j;
  uint pad;
  uint len_2;
  u32 ret__12;
  u32 ret__11;
  u32 ret__10;
  u32 ret__9;
  u32 ret__8;
  u32 ret__7;
  u32 ret__6;
  u32 ret__5;
  u32 ret__4;
  u32 ret__3;
  u32 ret__2;
  uchar *ptr;
  uint off;
  uint len_1;
  u64 ret__1;
  uint len;
  u64 ret_;
  u64 seqnum;
  u8 *IVs;
  size_t ret;
  uint processed;
  uint minblocks;
  uint x4;
  uint i;
  uint packlen;
  uint last;
  uint frag;
  SHA256_MB_CTX *mctx;
  anon_union_128_3_4e909ff0 blocks [8];
  uchar storage [288];
  CIPH_DESC ciph_d [8];
  HASH_DESC edges [8];
  HASH_DESC hash_d [8];
  PROV_AES_HMAC_SHA256_CTX *sctx;
  PROV_AES_HMAC_SHA_CTX *ctx;
  uint local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint in_stack_fffffffffffff734;
  undefined4 in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  uint local_884;
  uint *local_7e0;
  size_t local_7d8;
  int local_7cc;
  uint local_7c8;
  uint local_7c0;
  uint local_7b8;
  uint local_7b4;
  undefined8 local_7a8;
  undefined8 local_7a0;
  uint local_798 [4];
  undefined1 auStack_788 [28];
  uint auStack_76c [16];
  uint auStack_72c [225];
  undefined1 local_3a8 [32];
  uint auStack_388 [8];
  uint auStack_368 [8];
  uint auStack_348 [8];
  uint auStack_328 [8];
  uint auStack_308 [8];
  uint auStack_2e8 [8];
  uint auStack_2c8 [8];
  uint auStack_2a8 [8];
  long local_288;
  undefined1 *local_280;
  uint auStack_278 [2];
  undefined8 local_270 [37];
  long local_148;
  long alStack_140 [15];
  long local_c8;
  uint auStack_c0 [2];
  undefined8 local_b8 [15];
  long local_40;
  long local_38;
  int local_2c;
  uint local_28;
  long local_20;
  uint *local_18;
  size_t local_8;
  
  uVar12 = in_R8D * 4;
  local_7cc = 0;
  local_7d8 = 0;
  local_40 = in_RDI;
  local_38 = in_RDI;
  local_2c = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = in_ECX;
  iVar13 = RAND_bytes_ex((OSSL_LIB_CTX *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                         (uchar *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                         CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                         in_stack_fffffffffffff734);
  if (iVar13 < 1) {
    local_8 = 0;
  }
  else {
    lVar9 = -((ulong)local_3a8 & 0x1f);
    ptr_00 = (void *)((long)auStack_388 + lVar9);
    local_7b4 = local_28 >> ((char)local_2c + 1U & 0x1f);
    local_7b8 = (local_28 + local_7b4) - (local_7b4 << ((char)local_2c + 1U & 0x1f));
    if ((local_7b4 < local_7b8) && ((local_7b8 + 0x16 & 0x3f) < uVar12 - 1)) {
      local_7b4 = local_7b4 + 1;
      local_7b8 = local_7b8 - (uVar12 - 1);
    }
    local_c8 = local_20;
    local_288 = local_20;
    local_280 = (undefined1 *)((long)local_18 + 0x15);
    *(ulong *)((long)local_18 + 5) = local_7a8;
    *(undefined8 *)((long)local_18 + 0xd) = local_7a0;
    local_270[0] = local_7a8;
    local_270[1] = local_7a0;
    local_7e0 = local_798;
    for (local_7c0 = 1; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
      lVar17 = *(long *)(auStack_c0 + (ulong)(local_7c0 - 1) * 4 + -2);
      *(ulong *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) = lVar17 + (ulong)local_7b4;
      (&local_288)[(ulong)local_7c0 * 5] = lVar17 + (ulong)local_7b4;
      *(ulong *)(auStack_278 + (ulong)local_7c0 * 10 + -2) =
           *(long *)(auStack_278 + (ulong)(local_7c0 - 1) * 10 + -2) +
           (ulong)((local_7b4 + 0x30 & 0xfffffff0) + 0x15);
      lVar17 = *(long *)(auStack_278 + (ulong)local_7c0 * 10 + -2);
      *(undefined8 *)(lVar17 + -0x10) = *(undefined8 *)local_7e0;
      *(undefined8 *)(lVar17 + -8) = *(undefined8 *)(local_7e0 + 2);
      local_270[(ulong)local_7c0 * 5] = *(undefined8 *)local_7e0;
      local_270[(ulong)local_7c0 * 5 + 1] = *(undefined8 *)(local_7e0 + 2);
      local_7e0 = local_7e0 + 4;
    }
    local_7a8 = *(ulong *)(local_40 + 0x300);
    uVar1 = local_7a8 >> 0x38;
    uVar2 = local_7a8 & 0xff000000000000;
    uVar3 = local_7a8 & 0xff0000000000;
    uVar4 = local_7a8 & 0xff00000000;
    uVar5 = local_7a8 & 0xff000000;
    uVar6 = local_7a8 & 0xff0000;
    uVar7 = local_7a8 & 0xff00;
    uVar8 = local_7a8 << 0x38;
    for (local_7c0 = 0; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
      if (local_7c0 == uVar12 - 1) {
        local_8d4 = local_7b8;
      }
      else {
        local_8d4 = local_7b4;
      }
      *(undefined4 *)((long)ptr_00 + (ulong)local_7c0 * 4) = *(undefined4 *)(local_40 + 0x2d8);
      *(undefined4 *)((long)auStack_368 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2dc);
      *(undefined4 *)((long)auStack_348 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2e0);
      *(undefined4 *)((long)auStack_328 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2e4);
      *(undefined4 *)((long)auStack_308 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2e8);
      *(undefined4 *)((long)auStack_2e8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2ec);
      *(undefined4 *)((long)auStack_2c8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2f0);
      *(undefined4 *)((long)auStack_2a8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x2f4);
      uVar16 = (uVar1 | uVar2 >> 0x28 | uVar3 >> 0x18 | uVar4 >> 8 | uVar5 << 8 | uVar6 << 0x18 |
                uVar7 << 0x28 | uVar8) + (ulong)local_7c0;
      (&local_7a8)[(ulong)local_7c0 * 0x10] =
           uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 | (uVar16 & 0xff0000000000) >> 0x18
           | (uVar16 & 0xff00000000) >> 8 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18
           | (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
      *(undefined1 *)(local_798 + (ulong)local_7c0 * 0x20 + -2) = *(undefined1 *)(local_40 + 0x308);
      *(undefined1 *)((long)local_798 + (ulong)local_7c0 * 0x80 + -7) =
           *(undefined1 *)(local_40 + 0x309);
      *(undefined1 *)((long)local_798 + (ulong)local_7c0 * 0x80 + -6) =
           *(undefined1 *)(local_40 + 0x30a);
      *(char *)((long)local_798 + (ulong)local_7c0 * 0x80 + -5) = (char)(local_8d4 >> 8);
      *(char *)(local_798 + (ulong)local_7c0 * 0x20 + -1) = (char)local_8d4;
      memcpy((void *)((long)local_798 + (ulong)local_7c0 * 0x80 + -3),
             *(void **)(auStack_c0 + (ulong)local_7c0 * 4 + -2),0x33);
      *(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) =
           *(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) + 0x33;
      auStack_c0[(ulong)local_7c0 * 4] = local_8d4 - 0x33 >> 6;
      alStack_140[(ulong)local_7c0 * 2 + -1] = (long)(&local_7a8 + (ulong)local_7c0 * 0x10);
      *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 1;
    }
    sha256_multi_block(ptr_00,&local_148,local_2c);
    if (local_7b8 < local_7b4) {
      local_8d8 = local_7b8;
    }
    else {
      local_8d8 = local_7b4;
    }
    local_7c8 = local_8d8 - 0x33 >> 6;
    if (0x20 < local_7c8) {
      for (local_7c0 = 0; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
        alStack_140[(ulong)local_7c0 * 2 + -1] = *(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2);
        *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 0x20;
        auStack_278[(ulong)local_7c0 * 10] = 0x80;
      }
      do {
        sha256_multi_block(ptr_00,&local_148,local_2c);
        aesni_multi_cbc_encrypt(&local_288,local_38 + 0xc0,local_2c);
        for (local_7c0 = 0; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
          lVar17 = *(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) + 0x800;
          *(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) = lVar17;
          alStack_140[(ulong)local_7c0 * 2 + -1] = lVar17;
          auStack_c0[(ulong)local_7c0 * 4] = auStack_c0[(ulong)local_7c0 * 4] - 0x20;
          *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 0x20;
          (&local_288)[(ulong)local_7c0 * 5] = (&local_288)[(ulong)local_7c0 * 5] + 0x800;
          *(long *)(auStack_278 + (ulong)local_7c0 * 10 + -2) =
               *(long *)(auStack_278 + (ulong)local_7c0 * 10 + -2) + 0x800;
          auStack_278[(ulong)local_7c0 * 10] = 0x80;
          lVar17 = *(long *)(auStack_278 + (ulong)local_7c0 * 10 + -2);
          local_270[(ulong)local_7c0 * 5] = *(undefined8 *)(lVar17 + -0x10);
          local_270[(ulong)local_7c0 * 5 + 1] = *(undefined8 *)(lVar17 + -8);
        }
        local_7cc = local_7cc + 0x800;
        local_7c8 = local_7c8 - 0x20;
      } while (0x20 < local_7c8);
    }
    sha256_multi_block(ptr_00,&local_c8,local_2c);
    memset(&local_7a8,0,0x400);
    for (local_7c0 = 0; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
      if (local_7c0 == uVar12 - 1) {
        local_8dc = local_7b8;
      }
      else {
        local_8dc = local_7b4;
      }
      uVar14 = (local_8dc - local_7cc) + -0x33 + auStack_c0[(ulong)local_7c0 * 4] * -0x40;
      memcpy(&local_7a8 + (ulong)local_7c0 * 0x10,
             (void *)(*(long *)(auStack_c0 + (ulong)local_7c0 * 4 + -2) +
                     (ulong)(auStack_c0[(ulong)local_7c0 * 4] * 0x40)),(ulong)uVar14);
      *(undefined1 *)((long)&local_7a8 + (ulong)uVar14 + (ulong)local_7c0 * 0x80) = 0x80;
      iVar13 = local_8dc + 0x4d;
      uVar15 = iVar13 * 8;
      if (uVar14 < 0x38) {
        auStack_76c[(ulong)local_7c0 * 0x20] =
             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | iVar13 * 0x8000000
        ;
        *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 1;
      }
      else {
        auStack_72c[(ulong)local_7c0 * 0x20] =
             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | iVar13 * 0x8000000
        ;
        *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 2;
      }
      alStack_140[(ulong)local_7c0 * 2 + -1] = (long)(&local_7a8 + (ulong)local_7c0 * 0x10);
    }
    sha256_multi_block(ptr_00,&local_148,local_2c);
    memset(&local_7a8,0,0x400);
    for (local_7c0 = 0; local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
      uVar14 = *(uint *)((long)ptr_00 + (ulong)local_7c0 * 4);
      *(uint *)(&local_7a8 + (ulong)local_7c0 * 0x10) =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)ptr_00 + (ulong)local_7c0 * 4) = *(undefined4 *)(local_40 + 0x268);
      uVar14 = *(uint *)((long)auStack_368 + (ulong)local_7c0 * 4 + lVar9);
      *(uint *)((long)&local_7a8 + (ulong)local_7c0 * 0x80 + 4) =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_368 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x26c);
      uVar14 = *(uint *)((long)auStack_348 + (ulong)local_7c0 * 4 + lVar9);
      local_798[(ulong)local_7c0 * 0x20 + -2] =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_348 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x270);
      uVar14 = *(uint *)((long)auStack_328 + (ulong)local_7c0 * 4 + lVar9);
      local_798[(ulong)local_7c0 * 0x20 + -1] =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_328 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x274);
      uVar14 = *(uint *)((long)auStack_308 + (ulong)local_7c0 * 4 + lVar9);
      local_798[(ulong)local_7c0 * 0x20] =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_308 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x278);
      uVar14 = *(uint *)((long)auStack_2e8 + (ulong)local_7c0 * 4 + lVar9);
      local_798[(ulong)local_7c0 * 0x20 + 1] =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_2e8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x27c);
      uVar14 = *(uint *)((long)auStack_2c8 + (ulong)local_7c0 * 4 + lVar9);
      local_798[(ulong)local_7c0 * 0x20 + 2] =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_2c8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x280);
      uVar14 = *(uint *)((long)auStack_2a8 + (ulong)local_7c0 * 4 + lVar9);
      *(uint *)(auStack_788 + (ulong)local_7c0 * 0x80 + -4) =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      *(undefined4 *)((long)auStack_2a8 + (ulong)local_7c0 * 4 + lVar9) =
           *(undefined4 *)(local_40 + 0x284);
      auStack_788[(ulong)local_7c0 * 0x80] = 0x80;
      auStack_76c[(ulong)local_7c0 * 0x20] = 0x30000;
      alStack_140[(ulong)local_7c0 * 2 + -1] = (long)(&local_7a8 + (ulong)local_7c0 * 0x10);
      *(undefined4 *)(alStack_140 + (ulong)local_7c0 * 2) = 1;
    }
    sha256_multi_block(ptr_00,&local_148,local_2c);
    for (local_7c0 = 0; puVar10 = local_18, local_7c0 < uVar12; local_7c0 = local_7c0 + 1) {
      if (local_7c0 == uVar12 - 1) {
        local_8e0 = local_7b8;
      }
      else {
        local_8e0 = local_7b4;
      }
      memcpy(*(void **)(auStack_278 + (ulong)local_7c0 * 10 + -2),
             (void *)(&local_288)[(ulong)local_7c0 * 5],(ulong)(local_8e0 - local_7cc));
      (&local_288)[(ulong)local_7c0 * 5] = *(long *)(auStack_278 + (ulong)local_7c0 * 10 + -2);
      local_18 = (uint *)((long)local_18 + (ulong)(local_8e0 + 0x15));
      uVar14 = *(uint *)((long)ptr_00 + (ulong)local_7c0 * 4);
      *local_18 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                  uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_368 + (ulong)local_7c0 * 4 + lVar9);
      local_18[1] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_348 + (ulong)local_7c0 * 4 + lVar9);
      local_18[2] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_328 + (ulong)local_7c0 * 4 + lVar9);
      local_18[3] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_308 + (ulong)local_7c0 * 4 + lVar9);
      local_18[4] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_2e8 + (ulong)local_7c0 * 4 + lVar9);
      local_18[5] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_2c8 + (ulong)local_7c0 * 4 + lVar9);
      local_18[6] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      uVar14 = *(uint *)((long)auStack_2a8 + (ulong)local_7c0 * 4 + lVar9);
      local_18[7] = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18;
      local_18 = local_18 + 8;
      iVar13 = -(local_8e0 + 0x20 & 0xf);
      uVar14 = iVar13 + 0xf;
      for (local_884 = 0; puVar11 = local_18, local_884 <= uVar14; local_884 = local_884 + 1) {
        local_18 = (uint *)((long)local_18 + 1);
        *(char *)puVar11 = (char)uVar14;
      }
      iVar13 = iVar13 + 0x10 + local_8e0 + 0x20;
      auStack_278[(ulong)local_7c0 * 10] = (uint)(iVar13 - local_7cc) >> 4;
      *(undefined1 *)puVar10 = *(undefined1 *)(local_40 + 0x308);
      *(undefined1 *)((long)puVar10 + 1) = *(undefined1 *)(local_40 + 0x309);
      *(undefined1 *)((long)puVar10 + 2) = *(undefined1 *)(local_40 + 0x30a);
      *(char *)((long)puVar10 + 3) = (char)((uint)(iVar13 + 0x10) >> 8);
      *(char *)(puVar10 + 1) = (char)(iVar13 + 0x10);
      local_7d8 = (iVar13 + 0x15) + local_7d8;
      local_20 = local_20 + (ulong)local_7b4;
    }
    aesni_multi_cbc_encrypt(&local_288,local_38 + 0xc0,local_2c);
    OPENSSL_cleanse(&local_7a8,0x400);
    OPENSSL_cleanse(ptr_00,0x100);
    *(size_t *)(local_38 + 0x1e8) = local_7d8;
    local_8 = local_7d8;
  }
  return local_8;
}

Assistant:

static size_t tls1_multi_block_encrypt(void *vctx,
                                       unsigned char *out,
                                       const unsigned char *inp,
                                       size_t inp_len, int n4x)
{                               /* n4x is 1 or 2 */
    PROV_AES_HMAC_SHA_CTX *ctx = (PROV_AES_HMAC_SHA_CTX *)vctx;
    PROV_AES_HMAC_SHA256_CTX *sctx = (PROV_AES_HMAC_SHA256_CTX *)vctx;
    HASH_DESC hash_d[8], edges[8];
    CIPH_DESC ciph_d[8];
    unsigned char storage[sizeof(SHA256_MB_CTX) + 32];
    union {
        u64 q[16];
        u32 d[32];
        u8 c[128];
    } blocks[8];
    SHA256_MB_CTX *mctx;
    unsigned int frag, last, packlen, i;
    unsigned int x4 = 4 * n4x, minblocks, processed = 0;
    size_t ret = 0;
    u8 *IVs;
#  if defined(BSWAP8)
    u64 seqnum;
#  endif

    /* ask for IVs in bulk */
    if (RAND_bytes_ex(ctx->base.libctx, (IVs = blocks[0].c), 16 * x4, 0) <= 0)
        return 0;

    mctx = (SHA256_MB_CTX *) (storage + 32 - ((size_t)storage % 32)); /* align */

    frag = (unsigned int)inp_len >> (1 + n4x);
    last = (unsigned int)inp_len + frag - (frag << (1 + n4x));
    if (last > frag && ((last + 13 + 9) % 64) < (x4 - 1)) {
        frag++;
        last -= x4 - 1;
    }

    packlen = 5 + 16 + ((frag + 32 + 16) & -16);

    /* populate descriptors with pointers and IVs */
    hash_d[0].ptr = inp;
    ciph_d[0].inp = inp;
    /* 5+16 is place for header and explicit IV */
    ciph_d[0].out = out + 5 + 16;
    memcpy(ciph_d[0].out - 16, IVs, 16);
    memcpy(ciph_d[0].iv, IVs, 16);
    IVs += 16;

    for (i = 1; i < x4; i++) {
        ciph_d[i].inp = hash_d[i].ptr = hash_d[i - 1].ptr + frag;
        ciph_d[i].out = ciph_d[i - 1].out + packlen;
        memcpy(ciph_d[i].out - 16, IVs, 16);
        memcpy(ciph_d[i].iv, IVs, 16);
        IVs += 16;
    }

#  if defined(BSWAP8)
    memcpy(blocks[0].c, sctx->md.data, 8);
    seqnum = BSWAP8(blocks[0].q[0]);
#  endif

    for (i = 0; i < x4; i++) {
        unsigned int len = (i == (x4 - 1) ? last : frag);
#  if !defined(BSWAP8)
        unsigned int carry, j;
#  endif

        mctx->A[i] = sctx->md.h[0];
        mctx->B[i] = sctx->md.h[1];
        mctx->C[i] = sctx->md.h[2];
        mctx->D[i] = sctx->md.h[3];
        mctx->E[i] = sctx->md.h[4];
        mctx->F[i] = sctx->md.h[5];
        mctx->G[i] = sctx->md.h[6];
        mctx->H[i] = sctx->md.h[7];

        /* fix seqnum */
#  if defined(BSWAP8)
        blocks[i].q[0] = BSWAP8(seqnum + i);
#  else
        for (carry = i, j = 8; j--;) {
            blocks[i].c[j] = ((u8 *)sctx->md.data)[j] + carry;
            carry = (blocks[i].c[j] - carry) >> (sizeof(carry) * 8 - 1);
        }
#  endif
        blocks[i].c[8] = ((u8 *)sctx->md.data)[8];
        blocks[i].c[9] = ((u8 *)sctx->md.data)[9];
        blocks[i].c[10] = ((u8 *)sctx->md.data)[10];
        /* fix length */
        blocks[i].c[11] = (u8)(len >> 8);
        blocks[i].c[12] = (u8)(len);

        memcpy(blocks[i].c + 13, hash_d[i].ptr, 64 - 13);
        hash_d[i].ptr += 64 - 13;
        hash_d[i].blocks = (len - (64 - 13)) / 64;

        edges[i].ptr = blocks[i].c;
        edges[i].blocks = 1;
    }

    /* hash 13-byte headers and first 64-13 bytes of inputs */
    sha256_multi_block(mctx, edges, n4x);
    /* hash bulk inputs */
#  define MAXCHUNKSIZE    2048
#  if     MAXCHUNKSIZE%64
#   error  "MAXCHUNKSIZE is not divisible by 64"
#  elif   MAXCHUNKSIZE
    /*
     * goal is to minimize pressure on L1 cache by moving in shorter steps,
     * so that hashed data is still in the cache by the time we encrypt it
     */
    minblocks = ((frag <= last ? frag : last) - (64 - 13)) / 64;
    if (minblocks > MAXCHUNKSIZE / 64) {
        for (i = 0; i < x4; i++) {
            edges[i].ptr = hash_d[i].ptr;
            edges[i].blocks = MAXCHUNKSIZE / 64;
            ciph_d[i].blocks = MAXCHUNKSIZE / 16;
        }
        do {
            sha256_multi_block(mctx, edges, n4x);
            aesni_multi_cbc_encrypt(ciph_d, &ctx->ks, n4x);

            for (i = 0; i < x4; i++) {
                edges[i].ptr = hash_d[i].ptr += MAXCHUNKSIZE;
                hash_d[i].blocks -= MAXCHUNKSIZE / 64;
                edges[i].blocks = MAXCHUNKSIZE / 64;
                ciph_d[i].inp += MAXCHUNKSIZE;
                ciph_d[i].out += MAXCHUNKSIZE;
                ciph_d[i].blocks = MAXCHUNKSIZE / 16;
                memcpy(ciph_d[i].iv, ciph_d[i].out - 16, 16);
            }
            processed += MAXCHUNKSIZE;
            minblocks -= MAXCHUNKSIZE / 64;
        } while (minblocks > MAXCHUNKSIZE / 64);
    }
#  endif
#  undef  MAXCHUNKSIZE
    sha256_multi_block(mctx, hash_d, n4x);

    memset(blocks, 0, sizeof(blocks));
    for (i = 0; i < x4; i++) {
        unsigned int len = (i == (x4 - 1) ? last : frag),
            off = hash_d[i].blocks * 64;
        const unsigned char *ptr = hash_d[i].ptr + off;

        off = (len - processed) - (64 - 13) - off; /* remainder actually */
        memcpy(blocks[i].c, ptr, off);
        blocks[i].c[off] = 0x80;
        len += 64 + 13;         /* 64 is HMAC header */
        len *= 8;               /* convert to bits */
        if (off < (64 - 8)) {
#  ifdef BSWAP4
            blocks[i].d[15] = BSWAP4(len);
#  else
            PUTU32(blocks[i].c + 60, len);
#  endif
            edges[i].blocks = 1;
        } else {
#  ifdef BSWAP4
            blocks[i].d[31] = BSWAP4(len);
#  else
            PUTU32(blocks[i].c + 124, len);
#  endif
            edges[i].blocks = 2;
        }
        edges[i].ptr = blocks[i].c;
    }

    /* hash input tails and finalize */
    sha256_multi_block(mctx, edges, n4x);

    memset(blocks, 0, sizeof(blocks));
    for (i = 0; i < x4; i++) {
#  ifdef BSWAP4
        blocks[i].d[0] = BSWAP4(mctx->A[i]);
        mctx->A[i] = sctx->tail.h[0];
        blocks[i].d[1] = BSWAP4(mctx->B[i]);
        mctx->B[i] = sctx->tail.h[1];
        blocks[i].d[2] = BSWAP4(mctx->C[i]);
        mctx->C[i] = sctx->tail.h[2];
        blocks[i].d[3] = BSWAP4(mctx->D[i]);
        mctx->D[i] = sctx->tail.h[3];
        blocks[i].d[4] = BSWAP4(mctx->E[i]);
        mctx->E[i] = sctx->tail.h[4];
        blocks[i].d[5] = BSWAP4(mctx->F[i]);
        mctx->F[i] = sctx->tail.h[5];
        blocks[i].d[6] = BSWAP4(mctx->G[i]);
        mctx->G[i] = sctx->tail.h[6];
        blocks[i].d[7] = BSWAP4(mctx->H[i]);
        mctx->H[i] = sctx->tail.h[7];
        blocks[i].c[32] = 0x80;
        blocks[i].d[15] = BSWAP4((64 + 32) * 8);
#  else
        PUTU32(blocks[i].c + 0, mctx->A[i]);
        mctx->A[i] = sctx->tail.h[0];
        PUTU32(blocks[i].c + 4, mctx->B[i]);
        mctx->B[i] = sctx->tail.h[1];
        PUTU32(blocks[i].c + 8, mctx->C[i]);
        mctx->C[i] = sctx->tail.h[2];
        PUTU32(blocks[i].c + 12, mctx->D[i]);
        mctx->D[i] = sctx->tail.h[3];
        PUTU32(blocks[i].c + 16, mctx->E[i]);
        mctx->E[i] = sctx->tail.h[4];
        PUTU32(blocks[i].c + 20, mctx->F[i]);
        mctx->F[i] = sctx->tail.h[5];
        PUTU32(blocks[i].c + 24, mctx->G[i]);
        mctx->G[i] = sctx->tail.h[6];
        PUTU32(blocks[i].c + 28, mctx->H[i]);
        mctx->H[i] = sctx->tail.h[7];
        blocks[i].c[32] = 0x80;
        PUTU32(blocks[i].c + 60, (64 + 32) * 8);
#  endif /* BSWAP */
        edges[i].ptr = blocks[i].c;
        edges[i].blocks = 1;
    }

    /* finalize MACs */
    sha256_multi_block(mctx, edges, n4x);

    for (i = 0; i < x4; i++) {
        unsigned int len = (i == (x4 - 1) ? last : frag), pad, j;
        unsigned char *out0 = out;

        memcpy(ciph_d[i].out, ciph_d[i].inp, len - processed);
        ciph_d[i].inp = ciph_d[i].out;

        out += 5 + 16 + len;

        /* write MAC */
        PUTU32(out + 0, mctx->A[i]);
        PUTU32(out + 4, mctx->B[i]);
        PUTU32(out + 8, mctx->C[i]);
        PUTU32(out + 12, mctx->D[i]);
        PUTU32(out + 16, mctx->E[i]);
        PUTU32(out + 20, mctx->F[i]);
        PUTU32(out + 24, mctx->G[i]);
        PUTU32(out + 28, mctx->H[i]);
        out += 32;
        len += 32;

        /* pad */
        pad = 15 - len % 16;
        for (j = 0; j <= pad; j++)
            *(out++) = pad;
        len += pad + 1;

        ciph_d[i].blocks = (len - processed) / 16;
        len += 16;              /* account for explicit iv */

        /* arrange header */
        out0[0] = ((u8 *)sctx->md.data)[8];
        out0[1] = ((u8 *)sctx->md.data)[9];
        out0[2] = ((u8 *)sctx->md.data)[10];
        out0[3] = (u8)(len >> 8);
        out0[4] = (u8)(len);

        ret += len + 5;
        inp += frag;
    }

    aesni_multi_cbc_encrypt(ciph_d, &ctx->ks, n4x);

    OPENSSL_cleanse(blocks, sizeof(blocks));
    OPENSSL_cleanse(mctx, sizeof(*mctx));

    ctx->multiblock_encrypt_len = ret;
    return ret;
}